

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.hpp
# Opt level: O2

ostream * argparse::operator<<(ostream *stream,Argument *argument)

{
  ostream *poVar1;
  stringstream nameStream;
  string asStack_1c8 [32];
  undefined1 *local_1a8;
  char *local_1a0;
  stringstream local_198 [16];
  undefined1 local_188 [376];
  
  std::__cxx11::stringstream::stringstream(local_198);
  local_1a8 = local_188;
  local_1a0 = " ";
  std::
  copy<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::ostream_iterator<std::__cxx11::string,char,std::char_traits<char>>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)asStack_1c8,
             (argument->mNames).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (ostream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>_>
              *)(argument->mNames).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish);
  std::__cxx11::stringbuf::str();
  poVar1 = std::operator<<(stream,asStack_1c8);
  poVar1 = std::operator<<(poVar1,"\t");
  std::operator<<(poVar1,(string *)&argument->mHelp);
  std::__cxx11::string::~string(asStack_1c8);
  if ((argument->field_0xac & 2) != 0) {
    std::operator<<(stream,"[Required]");
  }
  std::operator<<(stream,"\n");
  std::__cxx11::stringstream::~stringstream(local_198);
  return stream;
}

Assistant:

std::ostream &operator<<(std::ostream &stream,
                                  const Argument &argument) {
    std::stringstream nameStream;
    std::copy(std::begin(argument.mNames), std::end(argument.mNames),
              std::ostream_iterator<std::string>(nameStream, " "));
    stream << nameStream.str() << "\t" << argument.mHelp;
    if (argument.mIsRequired)
      stream << "[Required]";
    stream << "\n";
    return stream;
  }